

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int __thiscall fmt::v6::internal::bigint::divmod_assign(bigint *this,bigint *divisor)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  uint *puVar4;
  int iVar5;
  long in_RSI;
  buffer<unsigned_int> *in_RDI;
  int quotient;
  int j;
  int i;
  int exp_difference;
  int num_bigits;
  size_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int local_4;
  
  iVar1 = compare((bigint *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                  (bigint *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (iVar1 < 0) {
    local_4 = 0;
  }
  else {
    sVar3 = buffer<unsigned_int>::size(in_RDI);
    iVar5 = (int)sVar3;
    iVar1 = *(int *)&in_RDI[5]._vptr_buffer - *(int *)(in_RSI + 0xa0);
    if (0 < iVar1) {
      to_unsigned<int>(iVar5 + iVar1);
      buffer<unsigned_int>::resize
                ((buffer<unsigned_int> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
      in_stack_ffffffffffffffdc = iVar5 + -1;
      in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffdc + iVar1;
      for (; -1 < in_stack_ffffffffffffffdc;
          in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc + -1) {
        puVar4 = buffer<unsigned_int>::operator[]<int>(in_RDI,in_stack_ffffffffffffffdc);
        in_stack_ffffffffffffffc4 = *puVar4;
        puVar4 = buffer<unsigned_int>::operator[]<int>(in_RDI,in_stack_ffffffffffffffd8);
        *puVar4 = in_stack_ffffffffffffffc4;
        in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 + -1;
      }
      buffer<unsigned_int>::data(in_RDI);
      in_stack_ffffffffffffffd4 = 0;
      std::uninitialized_fill_n<unsigned_int*,int,int>
                ((uint *)(ulong)in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20),
                 (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      *(int *)&in_RDI[5]._vptr_buffer = *(int *)&in_RDI[5]._vptr_buffer - iVar1;
    }
    local_4 = 0;
    do {
      subtract_aligned((bigint *)CONCAT44(iVar5,iVar1),
                       (bigint *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      local_4 = local_4 + 1;
      iVar2 = compare((bigint *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      (bigint *)CONCAT44(in_stack_ffffffffffffffd4,local_4));
    } while (-1 < iVar2);
  }
  return local_4;
}

Assistant:

int divmod_assign(const bigint& divisor) {
    FMT_ASSERT(this != &divisor, "");
    if (compare(*this, divisor) < 0) return 0;
    int num_bigits = static_cast<int>(bigits_.size());
    FMT_ASSERT(divisor.bigits_[divisor.bigits_.size() - 1u] != 0, "");
    int exp_difference = exp_ - divisor.exp_;
    if (exp_difference > 0) {
      // Align bigints by adding trailing zeros to simplify subtraction.
      bigits_.resize(to_unsigned(num_bigits + exp_difference));
      for (int i = num_bigits - 1, j = i + exp_difference; i >= 0; --i, --j)
        bigits_[j] = bigits_[i];
      std::uninitialized_fill_n(bigits_.data(), exp_difference, 0);
      exp_ -= exp_difference;
    }
    int quotient = 0;
    do {
      subtract_aligned(divisor);
      ++quotient;
    } while (compare(*this, divisor) >= 0);
    return quotient;
  }